

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_IRCJoin.cpp
# Opt level: O2

bool __thiscall RenX_IRCJoinPlugin::initialize(RenX_IRCJoinPlugin *this)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  string_view in_key;
  string_view in_key_00;
  string_view in_key_01;
  string_view in_key_02;
  string_view in_key_03;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  this_00 = &this->field_0x38;
  in_key._M_str = "PublicOnly";
  in_key._M_len = 10;
  bVar1 = Jupiter::Config::get<bool>((Config *)this_00,in_key,true);
  this->publicOnly = bVar1;
  in_key_00._M_str = "Join.MsgAlways";
  in_key_00._M_len = 0xe;
  bVar1 = Jupiter::Config::get<bool>((Config *)this_00,in_key_00,false);
  this->joinMsgAlways = bVar1;
  in_key_01._M_str = "Part.MsgAlways";
  in_key_01._M_len = 0xe;
  bVar1 = Jupiter::Config::get<bool>((Config *)this_00,in_key_01,false);
  this->partMsgAlways = bVar1;
  in_key_02._M_str = "Part.MinAccess";
  in_key_02._M_len = 0xe;
  iVar2 = Jupiter::Config::get<int>((Config *)this_00,in_key_02,0);
  this->minAccessPartMessage = iVar2;
  in_key_03._M_str = "Part.MaxAccess";
  in_key_03._M_len = 0xe;
  iVar2 = Jupiter::Config::get<int>((Config *)this_00,in_key_03,-1);
  this->maxAccessPartMessage = iVar2;
  local_38 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get(this_00,7,"NameTag",6,"{NAME}");
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->nameTag,&local_38);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,10,"ChannelTag",6,"{CHAN}");
  local_38 = bVar3;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->chanTag,&local_38);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0xd,"PartReasonTag",8,"{REASON}");
  local_38 = bVar3;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->partReasonTag,&local_38);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0xb,"Join.Format",0x19,"{NAME} has joined {CHAN}!");
  local_38 = bVar3;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->joinFmt,&local_38);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0xb,"Part.Format",0x22,"{NAME} has left {CHAN} ({REASON})!");
  local_38 = bVar3;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->partFmt,&local_38);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(this_00,0x13,"Part.FormatNoReason",0x17,"{NAME} has left {CHAN}!");
  local_38 = bVar3;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->partFmtNoReason,&local_38);
  return true;
}

Assistant:

bool RenX_IRCJoinPlugin::initialize() {
	RenX_IRCJoinPlugin::publicOnly = this->config.get<bool>("PublicOnly"sv, true);
	RenX_IRCJoinPlugin::joinMsgAlways = this->config.get<bool>("Join.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::partMsgAlways = this->config.get<bool>("Part.MsgAlways"sv, false);
	RenX_IRCJoinPlugin::minAccessPartMessage = this->config.get<int>("Part.MinAccess"sv, 0);
	RenX_IRCJoinPlugin::maxAccessPartMessage = this->config.get<int>("Part.MaxAccess"sv, -1);
	RenX_IRCJoinPlugin::nameTag = this->config.get("NameTag"sv, "{NAME}"sv);
	RenX_IRCJoinPlugin::chanTag = this->config.get("ChannelTag"sv, "{CHAN}"sv);
	RenX_IRCJoinPlugin::partReasonTag = this->config.get("PartReasonTag"sv, "{REASON}"sv);
	RenX_IRCJoinPlugin::joinFmt = this->config.get("Join.Format"sv, "{NAME} has joined {CHAN}!"sv);
	RenX_IRCJoinPlugin::partFmt = this->config.get("Part.Format"sv, "{NAME} has left {CHAN} ({REASON})!"sv);
	RenX_IRCJoinPlugin::partFmtNoReason = this->config.get("Part.FormatNoReason"sv, "{NAME} has left {CHAN}!"sv);

	return true;
}